

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

bool __thiscall
libcellml::Importer::ImporterImpl::fetchModel
          (ImporterImpl *this,ImportSourcePtr *importSource,string *baseFile)

{
  ImportLibrary *this_00;
  IssueImpl *pIVar1;
  element_type *input;
  bool bVar2;
  ReferenceRule RVar3;
  size_type sVar4;
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t sVar6;
  size_t sVar7;
  IssuePtr issue_2;
  IssuePtr issue;
  ParserPtr parser;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
  local_428;
  ModelPtr model;
  string url;
  stringstream buffer;
  ostream local_3b0 [376];
  ifstream file;
  streambuf local_228 [16];
  int aiStack_218 [122];
  
  ImportSource::url_abi_cxx11_
            ((string *)&file,
             (importSource->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr);
  normaliseDirectorySeparator(&url,(string *)&file);
  std::__cxx11::string::~string((string *)&file);
  this_00 = &this->mLibrary;
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::count(this_00,&url);
  if (sVar4 == 0) {
    resolvePath((string *)&file,&url,baseFile);
    std::__cxx11::string::operator=((string *)&url,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
  }
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::count(this_00,&url);
  if (sVar4 == 0) {
    std::ifstream::ifstream(&file,(string *)&url,_S_in);
    if (*(int *)((long)aiStack_218 + *(long *)(_file + -0x18)) != 0) {
      Issue::IssueImpl::create();
      pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      std::operator+(&local_428.first,"The attempt to resolve imports with the model at \'",&url);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                     &local_428.first,"\' failed: the file could not be opened.");
      Issue::IssueImpl::setDescription(pIVar1,(string *)&buffer);
      std::__cxx11::string::~string((string *)&buffer);
      std::__cxx11::string::~string((string *)&local_428);
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,importSource);
      Issue::IssueImpl::setReferenceRule
                ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,IMPORTER_MISSING_FILE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
LAB_001edf8a:
      std::ifstream::~ifstream(&file);
      bVar2 = false;
      goto LAB_001edf99;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
    std::ostream::operator<<(local_3b0,local_228);
    bVar2 = Strict::isStrict(&this->mImporter->super_Strict);
    Parser::create((Parser *)&parser,bVar2);
    input = parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::stringbuf::str();
    Parser::parseModel((Parser *)&issue,(string *)input);
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&issue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&local_428);
    bVar2 = Strict::isStrict(&this->mImporter->super_Strict);
    if (!bVar2) {
      sVar6 = Logger::messageCount
                        (&(parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_Logger);
      if (sVar6 != 0) {
        Issue::IssueImpl::create();
        pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        Logger::message((Logger *)&issue_2,
                        (size_t)parser.
                                super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
        Issue::description_abi_cxx11_
                  (&local_428.first,
                   issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        Issue::IssueImpl::setDescription(pIVar1,&local_428.first);
        std::__cxx11::string::~string((string *)&local_428);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        Issue::IssueImpl::setLevel
                  ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl,MESSAGE);
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,importSource);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    sVar6 = Logger::errorCount(&(parser.
                                 super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->super_Logger);
    if (sVar6 != 0) {
      for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
        Logger::error((Logger *)&local_428,
                      (size_t)parser.
                              super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
        RVar3 = Issue::referenceRule((Issue *)local_428.first._M_dataplus._M_p);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.first._M_string_length);
        if (RVar3 == XML) {
          Issue::IssueImpl::create();
          pIVar1 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue
                         ,"The attempt to import the model at \'",&url);
          std::operator+(&local_428.first,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue
                         ,"\' failed: the file is not valid XML.");
          Issue::IssueImpl::setDescription(pIVar1,&local_428.first);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&issue);
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                    ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,importSource);
          bVar2 = Strict::isStrict(&this->mImporter->super_Strict);
          if (bVar2) {
            Issue::IssueImpl::setReferenceRule
                      ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,IMPORTER_NULL_MODEL);
          }
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
          goto LAB_001edf8a;
        }
        Logger::error((Logger *)&local_428,
                      (size_t)parser.
                              super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_428);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_428.first._M_string_length);
      }
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<libcellml::Model>_&,_true>
              (&local_428,&url,&model);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<libcellml::Model>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Model>>>>
                *)this_00,&local_428);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>
    ::~pair(&local_428);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
    std::ifstream::~ifstream(&file);
  }
  else {
    p_Var5 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
              ::operator[](this_00,&url)->
              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
  }
  bVar2 = true;
  ImportSource::setModel
            ((importSource->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr,&model);
LAB_001edf99:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&url);
  return bVar2;
}

Assistant:

bool Importer::ImporterImpl::fetchModel(const ImportSourcePtr &importSource, const std::string &baseFile)
{
    std::string url = normaliseDirectorySeparator(importSource->url());
    if (mLibrary.count(url) == 0) {
        url = resolvePath(url, baseFile);
    }

    ModelPtr model;
    if (mLibrary.count(url) == 0) {
        // If the URL has not ever been resolved into a model in this library, with or
        // without baseFile, parse it and save.
        std::ifstream file(url);
        if (!file.good()) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("The attempt to resolve imports with the model at '" + url + "' failed: the file could not be opened.");
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_FILE);
            addIssue(issue);
            return false;
        }
        std::stringstream buffer;
        buffer << file.rdbuf();
        auto parser = Parser::create(mImporter->isStrict());
        model = parser->parseModel(buffer.str());
        if (!mImporter->isStrict() && (parser->messageCount() > 0)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription(parser->message(0)->description());
            issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            addIssue(issue);
        }
        auto errorCount = parser->errorCount();
        if (errorCount > 0) {
            for (size_t index = 0; index < errorCount; ++index) {
                if (parser->error(index)->referenceRule() == Issue::ReferenceRule::XML) {
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("The attempt to import the model at '" + url + "' failed: the file is not valid XML.");
                    issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                    if (mImporter->isStrict()) {
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
                    }
                    addIssue(issue);
                    return false;
                }
                addIssue(parser->error(index));
            }
        }
        mLibrary.insert(std::make_pair(url, model));
    } else {
        model = mLibrary[url];
    }
    importSource->setModel(model);
    return true;
}